

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O1

void (anonymous_namespace)::Scaler4x<(anonymous_namespace)::ColorGradientARGB>::alphaGrad<1u,3u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *pixBack;
  uVar4 = pixFront >> 0x18;
  uVar3 = uVar1 >> 0x17 & 0xfffffffe;
  uVar2 = uVar3 + uVar4;
  if (uVar2 == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = ((uVar1 & 0xff) * uVar3 + (pixFront & 0xff) * uVar4) / uVar2 & 0xff |
            (((uVar1 >> 8 & 0xff) * uVar3 + (pixFront >> 8 & 0xff) * uVar4) / uVar2 & 0xff) << 8 |
            (((uVar1 >> 0x10 & 0xff) * uVar3 + (pixFront >> 0x10 & 0xff) * uVar4) / uVar2 & 0xff) <<
            0x10 | ((uint)((ulong)uVar2 * 0xaaaaaaab >> 0x20) & 0xfffffffe) << 0x17;
  }
  *pixBack = uVar1;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront)
    {
        pixBack = gradientARGB<M, N>(pixFront, pixBack);
    }